

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O2

TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> * __thiscall
Imf_3_2::Header::typedAttribute<Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>>
          (Header *this,char *name)

{
  Attribute *pAVar1;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *pTVar2;
  TypeExc *this_00;
  
  pAVar1 = operator[](this,name);
  pTVar2 = (TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *)
           __dynamic_cast(pAVar1,&Attribute::typeinfo,
                          &TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::typeinfo,0);
  if (pTVar2 != (TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *)0x0) {
    return pTVar2;
  }
  this_00 = (TypeExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::TypeExc::TypeExc(this_00,"Unexpected attribute type.");
  __cxa_throw(this_00,&Iex_3_2::TypeExc::typeinfo,Iex_3_2::TypeExc::~TypeExc);
}

Assistant:

const T&
Header::typedAttribute (const char name[]) const
{
    const Attribute* attr  = &(*this)[name];
    const T*         tattr = dynamic_cast<const T*> (attr);

    if (tattr == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return *tattr;
}